

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O0

void ABC_Dump_Bench_File(ABC_Manager mng)

{
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  char *local_30;
  char *pFileName;
  Abc_Ntk_t *pNtkAig;
  Abc_Ntk_t *pNtkTemp;
  ABC_Manager mng_local;
  
  pNtk = Abc_NtkStrash(mng->pNtk,0,0,0);
  pNtk_00 = Abc_NtkToNetlistBench(pNtk);
  Abc_NtkDelete(pNtk);
  if (pNtk_00 == (Abc_Ntk_t *)0x0) {
    printf("ABC_Dump_Bench_File: Dumping BENCH has failed.\n");
  }
  else {
    if (mng->pDumpFileName == (char *)0x0) {
      local_30 = "abc_test.bench";
    }
    else {
      local_30 = mng->pDumpFileName;
    }
    Io_WriteBench(pNtk_00,local_30);
    Abc_NtkDelete(pNtk_00);
  }
  return;
}

Assistant:

void ABC_Dump_Bench_File( ABC_Manager mng )
{
    Abc_Ntk_t * pNtkTemp, * pNtkAig;
    const char * pFileName;
 
    // derive the netlist
    pNtkAig = Abc_NtkStrash( mng->pNtk, 0, 0, 0 );
    pNtkTemp = Abc_NtkToNetlistBench( pNtkAig );
    Abc_NtkDelete( pNtkAig );
    if ( pNtkTemp == NULL ) 
        { printf( "ABC_Dump_Bench_File: Dumping BENCH has failed.\n" ); return; }
    pFileName = mng->pDumpFileName? mng->pDumpFileName: "abc_test.bench";
    Io_WriteBench( pNtkTemp, pFileName );
    Abc_NtkDelete( pNtkTemp );
}